

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O1

long vorbis_book_decodevs_add(codebook *book,float *a,oggpack_buffer *b,int n)

{
  bool bVar1;
  long lVar2;
  oggpack_buffer *b_00;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long alStack_60 [3];
  oggpack_buffer *local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = b;
  if (0 < book->used_entries) {
    lVar10 = (long)n;
    lVar3 = lVar10 / book->dim;
    uVar11 = (uint)lVar3;
    lVar2 = -((long)(int)uVar11 * 8 + 0xfU & 0xfffffffffffffff0);
    bVar1 = 0 < (int)uVar11;
    alStack_60[2] = lVar3;
    if ((int)uVar11 < 1) {
LAB_001d91da:
      local_38._0_1_ = bVar1;
      lVar3 = book->dim;
      if (0 < lVar3) {
        lVar4 = (long)(int)alStack_60[2];
        lVar5 = 1;
        lVar6 = 0;
        lVar7 = 0;
        do {
          if ((0 < (int)alStack_60[2]) && (lVar7 < lVar10)) {
            lVar8 = 1;
            lVar9 = lVar5;
            do {
              a[lVar9 + -1] =
                   *(float *)(*(long *)((long)alStack_60 + lVar8 * 8 + lVar2) + lVar6 * 4) +
                   a[lVar9 + -1];
              if (lVar4 <= lVar8) break;
              lVar8 = lVar8 + 1;
              bVar1 = lVar9 < lVar10;
              lVar9 = lVar9 + 1;
            } while (bVar1);
          }
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + lVar4;
          lVar5 = lVar5 + lVar4;
        } while (lVar6 != lVar3);
      }
    }
    else {
      local_38 = CONCAT71(local_38._1_7_,0 < (int)uVar11);
      *(undefined8 *)((long)alStack_60 + lVar2) = 0x1d916b;
      lVar4 = decode_packed_entry_number(book,b);
      if (lVar4 != -1) {
        local_40 = (ulong)(uVar11 & 0x7fffffff);
        local_38 = (ulong)(uVar11 & 0x7fffffff) - 1;
        uVar12 = 0;
        do {
          *(float **)((long)alStack_60 + uVar12 * 8 + lVar2 + 8) =
               book->valuelist + lVar4 * book->dim;
          b_00 = local_48;
          if (local_38 == uVar12) {
            bVar1 = uVar12 + 1 < local_40;
            goto LAB_001d91da;
          }
          *(undefined8 *)((long)alStack_60 + lVar2) = 0x1d91b8;
          lVar4 = decode_packed_entry_number(book,b_00);
          uVar12 = uVar12 + 1;
        } while (lVar4 != -1);
        local_38._0_1_ = uVar12 < local_40;
      }
    }
    if ((char)local_38 != '\0') {
      return -1;
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodevs_add(codebook *book,float *a,oggpack_buffer *b,int n){
  if(book->used_entries>0){
    int step=n/book->dim;
    long *entry = alloca(sizeof(*entry)*step);
    float **t = alloca(sizeof(*t)*step);
    int i,j,o;

    for (i = 0; i < step; i++) {
      entry[i]=decode_packed_entry_number(book,b);
      if(entry[i]==-1)return(-1);
      t[i] = book->valuelist+entry[i]*book->dim;
    }
    for(i=0,o=0;i<book->dim;i++,o+=step)
      for (j=0;o+j<n && j<step;j++)
        a[o+j]+=t[j][i];
  }
  return(0);
}